

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_query_result.cpp
# Opt level: O2

string * __thiscall
duckdb::StreamQueryResult::ToString_abi_cxx11_
          (string *__return_storage_ptr__,StreamQueryResult *this)

{
  string local_30;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if ((this->super_QueryResult).super_BaseQueryResult.success == true) {
    QueryResult::HeaderToString_abi_cxx11_(&local_30,&this->super_QueryResult);
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_30);
    ::std::__cxx11::string::~string((string *)&local_30);
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  else {
    ::std::operator+(&local_30,&(this->super_QueryResult).super_BaseQueryResult.error.final_message,
                     anon_var_dwarf_3b657a3 + 8);
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_30);
    ::std::__cxx11::string::~string((string *)&local_30);
  }
  return __return_storage_ptr__;
}

Assistant:

string StreamQueryResult::ToString() {
	string result;
	if (success) {
		result = HeaderToString();
		result += "[[STREAM RESULT]]";
	} else {
		result = GetError() + "\n";
	}
	return result;
}